

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O3

int absl::lts_20250127::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  ulong uVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  
  if (0x10 < max_digits) {
    __assert_fail("max_digits * 4 <= std::numeric_limits<T>::digits",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                  ,0xfe,
                  "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                 );
  }
  uVar6 = *out;
  pbVar1 = (byte *)begin;
  if (begin != end && uVar6 == 0) {
    do {
      if (*pbVar1 != 0x30) break;
      pbVar1 = pbVar1 + 1;
    } while (pbVar1 != (byte *)end);
  }
  pbVar3 = pbVar1 + (uint)max_digits;
  if ((long)end - (long)pbVar1 <= (long)(ulong)(uint)max_digits) {
    pbVar3 = (byte *)end;
  }
  pbVar2 = pbVar1;
  if (pbVar1 < pbVar3) {
    lVar7 = (long)pbVar3 - (long)pbVar1;
    do {
      uVar8 = (ulong)(char)kAsciiToInt[*pbVar1];
      pbVar2 = pbVar1;
      if ((long)uVar8 < 0) break;
      uVar5 = uVar6 * 0x10;
      if (uVar5 < uVar6) {
        __assert_fail("accumulator * base >= accumulator",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                      ,0x10e,
                      "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                     );
      }
      uVar6 = uVar5 + uVar8;
      if (CARRY8(uVar5,uVar8)) {
        __assert_fail("accumulator + digit >= accumulator",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                      ,0x110,
                      "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                     );
      }
      pbVar1 = pbVar1 + 1;
      lVar7 = lVar7 + -1;
      pbVar2 = pbVar3;
    } while (lVar7 != 0);
  }
  if (pbVar2 < end) {
    lVar7 = (long)end - (long)pbVar2;
    pbVar1 = pbVar2 + lVar7;
    bVar4 = false;
    pbVar3 = pbVar2;
    do {
      pbVar2 = pbVar3;
      if ((char)kAsciiToInt[*pbVar3] < '\0') break;
      bVar4 = (bool)(bVar4 | *pbVar3 != 0x30);
      pbVar3 = pbVar3 + 1;
      lVar7 = lVar7 + -1;
      pbVar2 = pbVar1;
    } while (lVar7 != 0);
    if ((dropped_nonzero_digit != (bool *)0x0) && (bVar4)) {
      *dropped_nonzero_digit = true;
    }
  }
  *out = uVar6;
  return (int)pbVar2 - (int)begin;
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}